

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.h
# Opt level: O0

void __thiscall
dg::vr::ValueRelations::set<dg::vr::Bucket,dg::vr::Bucket>
          (ValueRelations *this,Bucket *lt,Type rel,Bucket *rt)

{
  bool ch_00;
  ValueRelations *in_RDI;
  pair<std::reference_wrapper<const_dg::vr::Bucket>,_bool> pVar1;
  bool ch;
  pair<std::reference_wrapper<const_dg::vr::Bucket>,_bool> rtHPair;
  Type in_stack_0000006c;
  Bucket *in_stack_00000070;
  pair<std::reference_wrapper<const_dg::vr::Bucket>,_bool> ltHPair;
  Handle in_stack_ffffffffffffff60;
  pair<std::reference_wrapper<const_dg::vr::Bucket>,_bool> local_70;
  Bucket *local_60;
  undefined1 local_58;
  Bucket *local_50;
  undefined1 local_48;
  Bucket *local_40;
  undefined1 local_38;
  pair<std::reference_wrapper<const_dg::vr::Bucket>,_bool> local_30 [3];
  
  pVar1 = get(in_stack_ffffffffffffff60);
  local_40 = (Bucket *)pVar1.first._M_data;
  local_38 = pVar1.second;
  local_30[0].first._M_data = local_40;
  local_30[0].second = (bool)local_38;
  pVar1 = get(in_stack_ffffffffffffff60);
  local_60 = (Bucket *)pVar1.first._M_data;
  local_58 = pVar1.second;
  local_50 = local_60;
  local_48 = local_58;
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pVar1 = get(in_stack_ffffffffffffff60);
    local_70.first = pVar1.first._M_data;
    local_70.second = pVar1.second;
    std::pair<std::reference_wrapper<const_dg::vr::Bucket>,_bool>::operator=(local_30,&local_70);
  }
  std::reference_wrapper::operator_cast_to_Bucket_
            ((reference_wrapper<const_dg::vr::Bucket> *)0x1d59de);
  std::reference_wrapper::operator_cast_to_Bucket_
            ((reference_wrapper<const_dg::vr::Bucket> *)0x1d59f8);
  ch_00 = RelationsGraph<dg::vr::ValueRelations>::addRelation
                    ((RelationsGraph<dg::vr::ValueRelations> *)ltHPair.first._M_data,
                     in_stack_00000070,in_stack_0000006c,(Bucket *)rtHPair._8_8_,
                     (Relations *)rtHPair.first._M_data);
  updateChanged(in_RDI,ch_00);
  return;
}

Assistant:

void set(const X &lt, Relations::Type rel, const Y &rt) {
        auto ltHPair = get(lt);
        auto rtHPair = get(rt);
        if (rtHPair.second) {
            ltHPair = get(lt);
            assert(!ltHPair.second);
        }
        bool ch = graph.addRelation(ltHPair.first, rel, rtHPair.first);
        updateChanged(ch);
    }